

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sx1231_ods.c
# Opt level: O2

int rf_send(rf_dev_t *dev,uint8_t *data,size_t len)

{
  int iVar1;
  ulong in_RAX;
  ulong uVar2;
  size_t len_00;
  ulong uVar3;
  uint8_t *data_00;
  ulong uStack_38;
  uint8_t val;
  
  len_00 = 0x42;
  if (len < 0x42) {
    len_00 = len;
  }
  uStack_38 = in_RAX;
  iVar1 = spi_write_regs(dev->fd,'\0',data,len_00);
  if ((iVar1 == 0) && (iVar1 = _switch_mode(dev,0xc), iVar1 == 0)) {
    data_00 = data + len_00;
    for (uVar3 = len - len_00; uVar3 != 0; uVar3 = uVar3 - uVar2) {
      do {
        iVar1 = spi_read_reg(dev->fd,'(',&val);
        if (iVar1 != 0) {
          return iVar1;
        }
      } while ((uStack_38 & 0x2000000000000000) != 0);
      uVar2 = 0x42 - (ulong)dev->fifo_thresh;
      if (uVar3 < uVar2) {
        uVar2 = uVar3;
      }
      uVar2 = uVar2 & 0xff;
      iVar1 = spi_write_regs(dev->fd,'\0',data_00,uVar2);
      if (iVar1 != 0) {
        return iVar1;
      }
      data_00 = data_00 + uVar2;
    }
    do {
      iVar1 = spi_read_reg(dev->fd,'(',&val);
      if (iVar1 != 0) {
        return iVar1;
      }
    } while ((uStack_38 & 0x800000000000000) == 0);
    iVar1 = _switch_mode(dev,4);
  }
  return iVar1;
}

Assistant:

int rf_send(rf_dev_t *dev, const uint8_t *data, size_t len)
{
	int err = ERR_UNSPEC;
	uint8_t send_len;
	uint8_t val;

	// Prefill Fifo
	send_len = (len <= SX1231_FIFO_SIZE) ? len : SX1231_FIFO_SIZE;
	TRY(spi_write_regs(dev->fd, RegFifo, data, send_len));
	data += send_len;
	len -= send_len;

	// Start TX
	TRY(_switch_mode(dev, OP_MODE_MODE_TX));

	while (len != 0) {
		// Wait till space in FIFO
		do {
			TRY(spi_read_reg(dev->fd, RegIrqFlags2, &val));
		} while (val & IRQ_FLAGS2_FIFOLEVEL);

		// Refill Fifo
		send_len = (len <= SX1231_FIFO_SIZE - dev->fifo_thresh) ? len : (SX1231_FIFO_SIZE - dev->fifo_thresh);
		TRY(spi_write_regs(dev->fd, RegFifo, data, send_len));
		data += send_len;
		len -= send_len;
	}

	// Wait till done
	do {
		TRY(spi_read_reg(dev->fd, RegIrqFlags2, &val));
	} while (! (val & IRQ_FLAGS2_PACKETSENT));

	TRY(_switch_mode(dev, OP_MODE_MODE_STDBY));

	return ERR_OK;
fail:
	return err;
}